

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nes_apu.c
# Opt level: O3

UINT32 nesapu_get_mute_mask(void *chip)

{
  return (uint)*(byte *)((long)chip + 0xc3) << 4 |
         (uint)*(byte *)((long)chip + 0x24) + (uint)*(byte *)((long)chip + 0x4c) * 2 +
         (uint)*(byte *)((long)chip + 0x74) * 4 + (uint)*(byte *)((long)chip + 0x97) * 8;
}

Assistant:

UINT32 nesapu_get_mute_mask(void* chip)
{
	nesapu_state *info = (nesapu_state*)chip;
	UINT32 muteMask;
	
	muteMask =	(info->APU.squ[0].Muted << 0) |
				(info->APU.squ[1].Muted << 1) |
				(info->APU.tri.Muted << 2) |
				(info->APU.noi.Muted << 3) |
				(info->APU.dpcm.Muted << 4);
	
	return muteMask;
}